

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ast.hpp
# Opt level: O0

void __thiscall
punky::ast::FunctionLiteral::FunctionLiteral
          (FunctionLiteral *this,Token *tok,OptFnParams *params,
          unique_ptr<punky::ast::BlockStmt,_std::default_delete<punky::ast::BlockStmt>_> *body)

{
  Token local_58;
  unique_ptr<punky::ast::BlockStmt,_std::default_delete<punky::ast::BlockStmt>_> *local_28;
  unique_ptr<punky::ast::BlockStmt,_std::default_delete<punky::ast::BlockStmt>_> *body_local;
  OptFnParams *params_local;
  Token *tok_local;
  FunctionLiteral *this_local;
  
  local_28 = body;
  body_local = (unique_ptr<punky::ast::BlockStmt,_std::default_delete<punky::ast::BlockStmt>_> *)
               params;
  params_local = (OptFnParams *)tok;
  tok_local = (Token *)this;
  punky::tok::Token::Token(&local_58,tok);
  ExprNode::ExprNode(&this->super_ExprNode,&local_58);
  punky::tok::Token::~Token(&local_58);
  (this->super_ExprNode).super_AstNode._vptr_AstNode = (_func_int **)&PTR__FunctionLiteral_00157a70;
  std::
  optional<std::unique_ptr<std::vector<punky::ast::Identifier,_std::allocator<punky::ast::Identifier>_>,_std::default_delete<std::vector<punky::ast::Identifier,_std::allocator<punky::ast::Identifier>_>_>_>_>
  ::optional(&this->m_params,params);
  std::unique_ptr<punky::ast::BlockStmt,_std::default_delete<punky::ast::BlockStmt>_>::unique_ptr
            (&this->m_body,body);
  return;
}

Assistant:

FunctionLiteral(Token tok, OptFnParams params,
                    std::unique_ptr<BlockStmt> body) :
      ExprNode{std::move(tok)},
      m_params{std::move(params)},
      m_body{std::move(body)}
    {}